

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbox.cpp
# Opt level: O1

Image * rw::xbox::rasterToImage(Raster *raster)

{
  uint8 uVar1;
  uint uVar2;
  uint8 *puVar3;
  int32 height;
  uint uVar4;
  bool bVar5;
  uint uVar6;
  Image *this;
  ulong uVar7;
  uint depth;
  int iVar8;
  size_t __n;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  int32 iVar13;
  uint uVar14;
  uint8 *puVar15;
  uint8 *__dest;
  uint uVar16;
  uint uVar17;
  long lVar18;
  uint8 *puVar19;
  uint8 *local_90;
  
  puVar3 = raster->pixels;
  if (puVar3 == (uint8 *)0x0) {
    Raster::lock(raster,0,2);
  }
  lVar18 = (long)nativeRasterOffset;
  if (*(char *)((long)&raster->height + lVar18 + 1) != '\x01') {
    uVar14 = raster->format;
    iVar9 = 0;
    if ((uVar14 >> 0xe & 1) == 0) {
      depth = 0x18;
      if ((uVar14 & 0xf00) != 0x600) {
        depth = (uint)((uVar14 & 0xf00) == 0x500) * 0x10 + 0x10;
      }
      bVar5 = true;
      if ((uVar14 >> 0xd & 1) != 0) {
        depth = 8;
        iVar9 = 0x100;
        goto LAB_00117f13;
      }
    }
    else {
      depth = 4;
      iVar9 = 0x10;
LAB_00117f13:
      bVar5 = false;
    }
    this = Image::create(raster->width,raster->height,depth);
    Image::allocate(this);
    if (!bVar5) {
      puVar19 = *(uint8 **)((long)&raster->flags + lVar18);
      puVar15 = this->palette;
      iVar9 = iVar9 + (uint)(iVar9 == 0);
      do {
        conv_BGRA8888_from_RGBA8888(puVar15,puVar19);
        puVar19 = puVar19 + 4;
        puVar15 = puVar15 + 4;
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
    }
    puVar19 = this->pixels;
    puVar15 = raster->pixels;
    uVar14 = this->width;
    uVar2 = this->height;
    iVar9 = this->bpp;
    __n = (size_t)iVar9;
    iVar8 = 1;
    uVar16 = 0;
    uVar10 = 0;
    uVar17 = 1;
    do {
      uVar11 = uVar17 * 2;
      uVar4 = uVar17;
      uVar6 = uVar11;
      if ((int)uVar14 <= iVar8) {
        uVar11 = 0;
        uVar4 = 0;
        uVar6 = uVar17;
      }
      uVar16 = uVar16 | uVar4;
      uVar4 = 0;
      uVar17 = uVar6;
      if (iVar8 < (int)uVar2) {
        uVar4 = uVar6;
        uVar17 = uVar6 * 2;
        uVar11 = uVar6 * 2;
      }
      uVar10 = uVar10 | uVar4;
      iVar8 = iVar8 * 2;
    } while (uVar11 != 0);
    if (0 < (int)uVar2) {
      uVar7 = 0;
      uVar17 = 0;
      local_90 = puVar19;
      do {
        if (0 < (int)uVar14) {
          uVar11 = 0;
          uVar12 = (ulong)uVar14;
          __dest = local_90;
          do {
            memcpy(__dest,puVar15 + (int)((uVar11 | uVar17) * iVar9),__n);
            uVar11 = uVar11 - uVar16 & uVar16;
            __dest = __dest + __n;
            uVar12 = uVar12 - 1;
          } while (uVar12 != 0);
        }
        uVar17 = uVar17 - uVar10 & uVar10;
        uVar7 = uVar7 + 1;
        local_90 = local_90 + (long)(int)uVar14 * __n;
      } while (uVar7 != uVar2);
    }
    if ((8 < depth) && (0 < this->height)) {
      iVar9 = 0;
      do {
        if (0 < this->width) {
          iVar8 = 0;
          puVar15 = puVar19;
          do {
            uVar14 = raster->format & 0xf00;
            if ((uVar14 == 0x600) || (uVar14 == 0x500)) {
              uVar1 = *puVar15;
              *puVar15 = puVar15[2];
              puVar15[2] = uVar1;
              puVar15 = puVar15 + this->bpp;
            }
            iVar8 = iVar8 + 1;
          } while (iVar8 < this->width);
        }
        puVar19 = puVar19 + this->stride;
        iVar9 = iVar9 + 1;
      } while (iVar9 < this->height);
    }
    Image::compressPalette(this);
    goto LAB_00118142;
  }
  iVar13 = raster->width;
  if (raster->width < 5) {
    iVar13 = 4;
  }
  height = 4;
  if (4 < raster->height) {
    height = raster->height;
  }
  this = Image::create(iVar13,height,0x20);
  Image::allocate(this);
  iVar9 = *(int *)((long)&raster->format + lVar18);
  if (iVar9 == 0xf) {
    iVar13 = 5;
LAB_0011811e:
    Image::setPixelsDXT(this,iVar13,raster->pixels);
  }
  else {
    if (iVar9 == 0xe) {
      iVar13 = 3;
      goto LAB_0011811e;
    }
    if (iVar9 != 0xc) {
      Image::destroy(this);
      this = (Image *)0x0;
      goto LAB_00118142;
    }
    Image::setPixelsDXT(this,1,raster->pixels);
    if (*(char *)((long)&raster->height + lVar18) == '\0') {
      Image::removeMask(this);
    }
  }
  this->width = raster->width;
  this->height = raster->height;
LAB_00118142:
  if (puVar3 == (uint8 *)0x0) {
    Raster::unlock(raster,0);
  }
  return this;
}

Assistant:

Image*
rasterToImage(Raster *raster)
{
	int32 depth;
	Image *image;

	bool unlock = false;
	if(raster->pixels == nil){
		raster->lock(0, Raster::LOCKREAD);
		unlock = true;
	}

	XboxRaster *natras = GETXBOXRASTEREXT(raster);
	if(natras->customFormat){
		int w = raster->width;
		int h = raster->height;
		// pixels are in the upper right corner
		if(w < 4) w = 4;
		if(h < 4) h = 4;
		image = Image::create(w, h, 32);
		image->allocate();
		uint8 *pix = raster->pixels;
		switch(natras->format){
		case D3DFMT_DXT1:
			image->setPixelsDXT(1, pix);
			// TODO: is this correct?
			if(!natras->hasAlpha)
				image->removeMask();
			break;
		case D3DFMT_DXT3:
			image->setPixelsDXT(3, pix);
			break;
		case D3DFMT_DXT5:
			image->setPixelsDXT(5, pix);
			break;
		default:
			assert(0 && "unknown format");
			image->destroy();
			if(unlock)
				raster->unlock(0);
			return nil;
		}
		// fix it up again
		image->width = raster->width;
		image->height = raster->height;

		if(unlock)
			raster->unlock(0);
		return image;
	}

	switch(raster->format & 0xF00){
	case Raster::C1555:
		depth = 16;
		break;
	case Raster::C8888:
		depth = 32;
		break;
	case Raster::C888:
		depth = 24;
		break;
	case Raster::C555:
		depth = 16;
		break;

	default:
	case Raster::C565:
	case Raster::C4444:
	case Raster::LUM8:
		assert(0 && "unsupported raster format");
	}
	int32 pallength = 0;
	if((raster->format & Raster::PAL4) == Raster::PAL4){
		depth = 4;
		pallength = 16;
	}else if((raster->format & Raster::PAL8) == Raster::PAL8){
		depth = 8;
		pallength = 256;
	}

	image = Image::create(raster->width, raster->height, depth);
	image->allocate();

	if(pallength){
		uint8 *out = image->palette;
		uint8 *in = (uint8*)natras->palette;
		// bytes are BGRA unlike regular d3d!
		for(int32 i = 0; i < pallength; i++){
			conv_BGRA8888_from_RGBA8888(out, in);
			in += 4;
			out += 4;
		}
	}

	uint8 *imgpixels = image->pixels;
	uint8 *pixels = raster->pixels;

	// NB:
	assert(image->bpp == (int)natras->bpp);
	assert(image->stride == raster->stride);
	unswizzle(imgpixels, pixels, image->width, image->height, image->bpp);
	// Fix RGB order
	uint8 tmp;
	if(depth > 8)
		for(int32 y = 0; y < image->height; y++){
			uint8 *imgrow = imgpixels;
		//	uint8 *rasrow = pixels;
			for(int32 x = 0; x < image->width; x++){
				switch(raster->format & 0xF00){
				case Raster::C8888:
				case Raster::C888:
					tmp = imgrow[0];
					imgrow[0] = imgrow[2];
					imgrow[2] = tmp;
					imgrow += image->bpp;
					break;
				}
			}
			imgpixels += image->stride;
		//	pixels += raster->stride;
		}
	image->compressPalette();

	if(unlock)
		raster->unlock(0);

	return image;
}